

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

bool __thiscall
cmCMakePresetsGraphInternal::MatchesCondition::Evaluate
          (MatchesCondition *this,MacroExpanderVector *expanders,int version,optional<bool> *out)

{
  bool bVar1;
  bool bVar2;
  ExpandMacroResult EVar3;
  string regexStr;
  string str;
  RegularExpression regex;
  string local_298;
  string local_278;
  RegularExpression local_258;
  
  std::__cxx11::string::string((string *)&local_278,(string *)&this->String);
  EVar3 = ExpandMacros(&local_278,expanders,version);
  if (EVar3 == Ignore) {
    bVar1 = true;
    if ((out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged == true) {
      (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
      _M_engaged = false;
    }
  }
  else if (EVar3 == Error) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_298,(string *)&this->Regex);
    EVar3 = ExpandMacros(&local_298,expanders,version);
    if (EVar3 == Ignore) {
      bVar1 = true;
      if ((out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool>._M_engaged == true) {
        (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged = false;
      }
    }
    else if (EVar3 == Error) {
      bVar1 = false;
    }
    else {
      local_258.regmust = (char *)0x0;
      local_258.program = (char *)0x0;
      local_258.progsize = 0;
      memset(&local_258,0,0x20a);
      bVar1 = cmsys::RegularExpression::compile(&local_258,local_298._M_dataplus._M_p);
      if (bVar1) {
        bVar2 = cmsys::RegularExpression::find(&local_258,local_278._M_dataplus._M_p);
        (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>
             = (_Optional_payload_base<bool>)(bVar2 | 0x100);
      }
      cmsys::RegularExpression::~RegularExpression(&local_258);
    }
    std::__cxx11::string::~string((string *)&local_298);
  }
  std::__cxx11::string::~string((string *)&local_278);
  return bVar1;
}

Assistant:

bool cmCMakePresetsGraphInternal::MatchesCondition::Evaluate(
  MacroExpanderVector const& expanders, int version,
  cm::optional<bool>& out) const
{
  std::string str = this->String;
  CHECK_EXPAND(out, str, expanders, version);
  std::string regexStr = this->Regex;
  CHECK_EXPAND(out, regexStr, expanders, version);

  cmsys::RegularExpression regex;
  if (!regex.compile(regexStr)) {
    return false;
  }

  out = regex.find(str);
  return true;
}